

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

ssize_t __thiscall llvm::raw_ostream::write(raw_ostream *this,int __fd,void *__buf,size_t __n)

{
  ulong Size;
  long lVar1;
  char *pcVar2;
  raw_ostream *__n_00;
  undefined4 in_register_00000034;
  char *Ptr;
  size_t BytesRemaining;
  size_t BytesToWrite;
  size_t NumBytes;
  size_t Size_local;
  char *Ptr_local;
  raw_ostream *this_local;
  
  Ptr = (char *)CONCAT44(in_register_00000034,__fd);
  pcVar2 = this->OutBufCur;
  this_local = this;
  if (this->OutBufEnd + -(long)pcVar2 < __buf) {
    if (this->OutBufStart == (char *)0x0) {
      if (this->BufferMode == Unbuffered) {
        (*this->_vptr_raw_ostream[8])(this,Ptr,__buf);
      }
      else {
        SetBuffered(this);
        this_local = (raw_ostream *)write(this,__fd,__buf,(size_t)pcVar2);
      }
    }
    else {
      Size = (long)this->OutBufEnd - (long)this->OutBufCur;
      if (this->OutBufCur == this->OutBufStart) {
        if (Size == 0) {
          __assert_fail("NumBytes != 0 && \"undefined behavior\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                        ,0x108,"raw_ostream &llvm::raw_ostream::write(const char *, size_t)");
        }
        lVar1 = (long)__buf - (ulong)__buf % Size;
        (*this->_vptr_raw_ostream[8])(this,Ptr,lVar1);
        pcVar2 = (char *)((long)__buf - lVar1);
        if (this->OutBufEnd + -(long)this->OutBufCur < pcVar2) {
          this_local = (raw_ostream *)
                       write(this,__fd + (int)lVar1,pcVar2,
                             (size_t)(this->OutBufEnd + -(long)this->OutBufCur));
        }
        else {
          copy_to_buffer(this,Ptr + lVar1,(size_t)pcVar2);
        }
      }
      else {
        __n_00 = this;
        copy_to_buffer(this,Ptr,Size);
        flush_nonempty(this);
        this_local = (raw_ostream *)
                     write(this,__fd + (int)Size,(void *)((long)__buf - Size),(size_t)__n_00);
      }
    }
  }
  else {
    copy_to_buffer(this,Ptr,(size_t)__buf);
  }
  return (ssize_t)this_local;
}

Assistant:

raw_ostream &raw_ostream::write(const char *Ptr, size_t Size) {
  // Group exceptional cases into a single branch.
  if (LLVM_UNLIKELY(size_t(OutBufEnd - OutBufCur) < Size)) {
    if (LLVM_UNLIKELY(!OutBufStart)) {
      if (BufferMode == BufferKind::Unbuffered) {
        write_impl(Ptr, Size);
        return *this;
      }
      // Set up a buffer and start over.
      SetBuffered();
      return write(Ptr, Size);
    }

    size_t NumBytes = OutBufEnd - OutBufCur;

    // If the buffer is empty at this point we have a string that is larger
    // than the buffer. Directly write the chunk that is a multiple of the
    // preferred buffer size and put the remainder in the buffer.
    if (LLVM_UNLIKELY(OutBufCur == OutBufStart)) {
      assert(NumBytes != 0 && "undefined behavior");
      size_t BytesToWrite = Size - (Size % NumBytes);
      write_impl(Ptr, BytesToWrite);
      size_t BytesRemaining = Size - BytesToWrite;
      if (BytesRemaining > size_t(OutBufEnd - OutBufCur)) {
        // Too much left over to copy into our buffer.
        return write(Ptr + BytesToWrite, BytesRemaining);
      }
      copy_to_buffer(Ptr + BytesToWrite, BytesRemaining);
      return *this;
    }

    // We don't have enough space in the buffer to fit the string in. Insert as
    // much as possible, flush and start over with the remainder.
    copy_to_buffer(Ptr, NumBytes);
    flush_nonempty();
    return write(Ptr + NumBytes, Size - NumBytes);
  }

  copy_to_buffer(Ptr, Size);

  return *this;
}